

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# araplanner.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
ARAPlanner::GetSearchPath
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ARAPlanner *this,
          ARASearchStateSpace_t *pSearchStateSpace,int *solcost)

{
  int iVar1;
  void *pvVar2;
  DiscreteSpaceInformation *pDVar3;
  runtime_error *this_00;
  ulong uVar4;
  ulong uVar5;
  pointer *ppiVar6;
  iterator iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  CMDPSTATE *__args;
  CMDPSTATE *pCVar12;
  vector<int,_std::allocator<int>_> CostV;
  vector<int,_std::allocator<int>_> SuccIDV;
  void *local_78;
  long lStack_70;
  long local_68;
  void *local_58;
  long lStack_50;
  long local_48;
  pointer *local_40;
  int *local_38;
  
  local_48 = 0;
  local_58 = (void *)0x0;
  lStack_50 = 0;
  local_68 = 0;
  local_78 = (void *)0x0;
  lStack_70 = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = solcost;
  if (this->bforwardsearch == true) {
    pCVar12 = pSearchStateSpace->searchgoalstate;
    __args = pSearchStateSpace->searchstartstate;
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x2e])(this,pSearchStateSpace);
    iVar7._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_40 = &(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (iVar7._M_current !=
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *iVar7._M_current = __args->StateID;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      goto LAB_00139246;
    }
  }
  else {
    __args = pSearchStateSpace->searchgoalstate;
    pCVar12 = pSearchStateSpace->searchstartstate;
    iVar7._M_current = (int *)0x0;
  }
  local_40 = &(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar7,&__args->StateID);
LAB_00139246:
  ppiVar6 = &(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *local_38 = 0;
  if (_stdout == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"ERROR: could not open file");
    *(undefined ***)this_00 = &PTR__runtime_error_00157508;
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  do {
    if ((((__args->StateID == pCVar12->StateID) ||
         (pvVar2 = __args->PlannerSpecificData, pvVar2 == (void *)0x0)) ||
        (*(long *)((long)pvVar2 + 0x38) == 0)) || (*(int *)((long)pvVar2 + 0x24) == 1000000000)) {
      if (local_78 != (void *)0x0) {
        operator_delete(local_78,local_68 - (long)local_78);
      }
      if (local_58 != (void *)0x0) {
        operator_delete(local_58,local_48 - (long)local_58);
      }
      return __return_storage_ptr__;
    }
    pDVar3 = (this->super_SBPLPlanner).environment_;
    (*pDVar3->_vptr_DiscreteSpaceInformation[5])
              (pDVar3,(ulong)(uint)__args->StateID,&local_58,&local_78);
    uVar8 = lStack_50 - (long)local_58 >> 2;
    if ((int)(uint)uVar8 < 1) {
      __args = *(CMDPSTATE **)((long)pvVar2 + 0x38);
      iVar10 = 1000000000;
    }
    else {
      uVar4 = lStack_70 - (long)local_78 >> 2;
      iVar10 = 1000000000;
      uVar11 = 0;
      do {
        uVar5 = uVar8;
        uVar9 = uVar8;
        if (uVar8 == uVar11) {
LAB_0013939d:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar9,uVar5);
        }
        __args = *(CMDPSTATE **)((long)pvVar2 + 0x38);
        if (*(int *)((long)local_58 + uVar11 * 4) == __args->StateID) {
          uVar5 = uVar4;
          uVar9 = uVar11;
          if (uVar4 <= uVar11) goto LAB_0013939d;
          iVar1 = *(int *)((long)local_78 + uVar11 * 4);
          if (iVar1 < iVar10) {
            iVar10 = iVar1;
          }
        }
        uVar11 = uVar11 + 1;
      } while (((uint)uVar8 & 0x7fffffff) != uVar11);
    }
    *local_38 = *local_38 + iVar10;
    iVar7._M_current = *ppiVar6;
    if (iVar7._M_current == *local_40) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar7,&__args->StateID);
    }
    else {
      *iVar7._M_current = __args->StateID;
      *ppiVar6 = iVar7._M_current + 1;
    }
  } while( true );
}

Assistant:

vector<int> ARAPlanner::GetSearchPath(ARASearchStateSpace_t* pSearchStateSpace, int& solcost)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    vector<int> wholePathIds;
    ARAState* searchstateinfo;
    CMDPSTATE* state = NULL;
    CMDPSTATE* goalstate = NULL;
    CMDPSTATE* startstate = NULL;

    if (bforwardsearch) {
        startstate = pSearchStateSpace->searchstartstate;
        goalstate = pSearchStateSpace->searchgoalstate;

        //reconstruct the path by setting bestnextstate pointers appropriately
        ReconstructPath(pSearchStateSpace);
    }
    else {
        startstate = pSearchStateSpace->searchgoalstate;
        goalstate = pSearchStateSpace->searchstartstate;
    }

    state = startstate;

    wholePathIds.push_back(state->StateID);
    solcost = 0;

    FILE* fOut = stdout;
    if (fOut == NULL) {
        throw SBPL_Exception("ERROR: could not open file");
    }
    while (state->StateID != goalstate->StateID) {
        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ARAState*)state->PlannerSpecificData;

        if (searchstateinfo->bestnextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }

        environment_->GetSuccs(state->StateID, &SuccIDV, &CostV);
        int actioncost = INFINITECOST;
        for (int i = 0; i < (int)SuccIDV.size(); i++) {
            if (SuccIDV.at(i) == searchstateinfo->bestnextstate->StateID && CostV.at(i) < actioncost) {
                actioncost = CostV.at(i);
            }
        }
        if (actioncost == INFINITECOST) SBPL_PRINTF("WARNING: actioncost = %d\n", actioncost);

        solcost += actioncost;

        //SBPL_FPRINTF(fDeb, "actioncost=%d between states %d and %d\n",
        //        actioncost, state->StateID, searchstateinfo->bestnextstate->StateID);
        //environment_->PrintState(state->StateID, false, fDeb);
        //environment_->PrintState(searchstateinfo->bestnextstate->StateID, false, fDeb);

#if DEBUG
        ARAState* nextstateinfo = (ARAState*)(searchstateinfo->bestnextstate->PlannerSpecificData);
        if (actioncost != abs((int)(searchstateinfo->g - nextstateinfo->g)) &&
            pSearchStateSpace->eps_satisfied <= 1.001)
        {
            SBPL_FPRINTF(fDeb, "ERROR: actioncost=%d is not matching the difference in g-values of %d\n",
                         actioncost, abs((int)(searchstateinfo->g - nextstateinfo->g)));
            SBPL_ERROR("ERROR: actioncost=%d is not matching the difference in g-values of %d\n",
                       actioncost,abs((int)(searchstateinfo->g - nextstateinfo->g)));
            PrintSearchState(searchstateinfo, fDeb);
            PrintSearchState(nextstateinfo, fDeb);
        }
#endif

        state = searchstateinfo->bestnextstate;

        wholePathIds.push_back(state->StateID);
    }

    return wholePathIds;
}